

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BayesianGameForDecPOMDPStage.cpp
# Opt level: O0

PartialJointPolicyDiscretePure * __thiscall
BayesianGameForDecPOMDPStage::ConstructExtendedPolicy
          (BayesianGameForDecPOMDPStage *this,PartialJointPolicyDiscretePure *jpolPrevTs,
          JointPolicyDiscretePure *jpolBG,
          vector<unsigned_long,_std::allocator<unsigned_long>_> *nrOHts,
          vector<unsigned_int,_std::allocator<unsigned_int>_> *firstOHtsI)

{
  value_type vVar1;
  PolicyDomainCategory PVar2;
  uint uVar3;
  undefined8 uVar4;
  PartialJointPolicyDiscretePure *this_00;
  size_t sVar5;
  ulong uVar6;
  reference pvVar7;
  reference pvVar8;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *in_RCX;
  ulong uVar9;
  JointPolicyDiscrete *in_RDX;
  JointPolicyDiscrete *in_RSI;
  long in_RDI;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *in_R8;
  Index ohI;
  Index type;
  Index agentI;
  PartialJointPolicyDiscretePure *jpolTs;
  PartialJointPolicyDiscretePure *in_stack_ffffffffffffff78;
  PartialJointPolicyPureVector *in_stack_ffffffffffffff80;
  char *in_stack_ffffffffffffff88;
  PartialJointPolicyDiscretePure *pPVar10;
  E *in_stack_ffffffffffffff90;
  uint local_48;
  uint local_44;
  
  PVar2 = JointPolicyDiscrete::GetPolicyDomainCategory(in_RSI);
  if (PVar2 != OHIST_INDEX) {
    uVar4 = __cxa_allocate_exception(0x28);
    E::E(in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
    __cxa_throw(uVar4,&E::typeinfo,E::~E);
  }
  PVar2 = JointPolicyDiscrete::GetPolicyDomainCategory(in_RDX);
  if (PVar2 != TYPE_INDEX) {
    uVar4 = __cxa_allocate_exception(0x28);
    E::E(in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
    __cxa_throw(uVar4,&E::typeinfo,E::~E);
  }
  this_00 = (PartialJointPolicyDiscretePure *)operator_new(0x88);
  PartialJointPolicyPureVector::PartialJointPolicyPureVector
            (in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
  pPVar10 = this_00;
  sVar5 = JointPolicy::GetDepth((JointPolicy *)this_00);
  (*(pPVar10->super_JointPolicyDiscretePure).super_JointPolicyDiscrete.super_JointPolicy.
    _vptr_JointPolicy[2])(pPVar10,sVar5 + 1);
  local_44 = 0;
  while( true ) {
    uVar9 = (ulong)local_44;
    uVar6 = (**(code **)(*(long *)(in_RDI + 0x20) + 0x18))(in_RDI + 0x20);
    if (uVar6 <= uVar9) break;
    local_48 = 0;
    while( true ) {
      uVar6 = (ulong)local_48;
      pvVar7 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                         (in_RCX,(ulong)local_44);
      if (*pvVar7 <= uVar6) break;
      pvVar8 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                         (in_R8,(ulong)local_44);
      vVar1 = *pvVar8;
      uVar3 = (*(in_RDX->super_JointPolicy)._vptr_JointPolicy[0x13])
                        (in_RDX,(ulong)local_44,(ulong)local_48);
      (*(this_00->super_JointPolicyDiscretePure).super_JointPolicyDiscrete.super_JointPolicy.
        _vptr_JointPolicy[0x10])(this_00,(ulong)local_44,(ulong)(local_48 + vVar1),(ulong)uVar3);
      local_48 = local_48 + 1;
    }
    local_44 = local_44 + 1;
  }
  return this_00;
}

Assistant:

PartialJointPolicyDiscretePure* 
BayesianGameForDecPOMDPStage::ConstructExtendedPolicy(
        PartialJointPolicyDiscretePure& jpolPrevTs, 
        JointPolicyDiscretePure& jpolBG, 
        vector<size_t>& nrOHts, 
        vector<Index>& firstOHtsI
        )
{
    //check policy types
    if(jpolPrevTs.GetPolicyDomainCategory() != PolicyGlobals::OHIST_INDEX)
        throw E("BayesianGameForDecPOMDPStage::ConstructExtendedPolicy --- jpolPrevTs.GetPolicyDomainCategory() != PolicyGlobals::OHIST_INDEX ");
    if(jpolBG.GetPolicyDomainCategory() != PolicyGlobals::TYPE_INDEX)
        throw E("BayesianGameForDecPOMDPStage::ConstructExtendedPolicy --- jpolPrevTs.GetPolicyDomainCategory() != PolicyGlobals::TYPE_INDEX ");
    //construct a policy for the DecPOMDP: 
    //a copy of jpolPrevTs with extended to this time step (ts) by 
    //jpolBG
    PartialJointPolicyDiscretePure* jpolTs = new 
        PartialJointPolicyPureVector(jpolPrevTs);
    jpolTs->SetDepth( jpolTs->GetDepth()+1 );
    for(Index agentI=0; agentI < GetNrAgents(); agentI++)
    {
        for(Index type = 0; type < nrOHts[agentI]; type++)
        {
            Index ohI = type + firstOHtsI[agentI];
            jpolTs->SetAction(agentI, ohI, 
                    jpolBG.GetActionIndex(agentI, type) );
        }         
    }
    return(jpolTs);
}